

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmInfo.cpp
# Opt level: O2

GMM_STATUS __thiscall
GmmLib::GmmMultiAdapterContext::RemoveContext(GmmMultiAdapterContext *this,ADAPTER_BDF sBdf)

{
  Context *__ptr;
  int32_t iVar1;
  GMM_ADAPTER_INFO *pNode;
  GMM_STATUS GVar2;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->MAContextSyncMutex);
  pNode = GetAdapterNodeUnlocked(this,sBdf);
  if (pNode == (GMM_ADAPTER_INFO *)0x0) {
    GVar2 = GMM_ERROR;
  }
  else {
    if (pNode->pGmmLibContext != (Context *)0x0) {
      iVar1 = Context::DecrementRefCount(pNode->pGmmLibContext);
      GVar2 = GMM_SUCCESS;
      if (iVar1 != 0) goto LAB_001bba36;
      Context::DestroyContext(pNode->pGmmLibContext);
      __ptr = pNode->pGmmLibContext;
      if (__ptr != (Context *)0x0) {
        pthread_mutex_destroy((pthread_mutex_t *)&__ptr->SyncMutex);
      }
      free(__ptr);
    }
    RemoveAdapterNode(this,pNode);
    GVar2 = GMM_SUCCESS;
  }
LAB_001bba36:
  pthread_mutex_unlock((pthread_mutex_t *)&this->MAContextSyncMutex);
  return GVar2;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmMultiAdapterContext::RemoveContext(ADAPTER_BDF sBdf)
{
    GMM_STATUS SyncLockStatus = LockMAContextSyncMutex();

    if (SyncLockStatus != GMM_SUCCESS)
    {
        return SyncLockStatus;
    }

    GmmLib::GMM_ADAPTER_INFO *pNode = GetAdapterNodeUnlocked(sBdf);
    GMM_LIB_ASSERT(pNode);
    if (!pNode)
    {
        UnLockMAContextSyncMutex();
        return GMM_ERROR;
    }

    if (pNode->pGmmLibContext)
    {
        int32_t ContextRefCount = pNode->pGmmLibContext->DecrementRefCount();
        // Refount = 0, It means that it the last client on this adapter
        // Lets free the LibContext and the Adapter Node
        if (!ContextRefCount)
        {
            pNode->pGmmLibContext->DestroyContext();
            // Delete/free the LibContext object
            delete pNode->pGmmLibContext;

            // Delete/free the AdapterNode from the Linked List
            RemoveAdapterNode(pNode);
            pNode = NULL;
        }
    }
    else
    {
        // No context exists for this node. Just remove it.
        RemoveAdapterNode(pNode);
        pNode = NULL;
    }

    UnLockMAContextSyncMutex();

    return GMM_SUCCESS;
}